

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

TerminalInfo * __thiscall plot::TerminalInfo::detect<void>(TerminalInfo *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  char (*in_RCX) [10];
  char (*needle) [8];
  char (*pacVar6) [6];
  char (*needle_00) [5];
  char (*needle_01) [7];
  string_view haystack;
  string_view haystack_00;
  string_view haystack_01;
  string_view haystack_02;
  string_view haystack_03;
  string_view haystack_04;
  string_view haystack_05;
  string_view haystack_06;
  string_view haystack_07;
  string_view haystack_08;
  string_view haystack_09;
  string_view haystack_10;
  string_view haystack_11;
  string_view cmd;
  string_view cmd_00;
  string_view terminator;
  string_view terminator_00;
  bool local_289;
  bool local_279;
  TerminalMode local_278;
  TerminalMode local_274;
  bool local_26e;
  byte local_26d;
  bool local_26c;
  bool local_26b;
  bool local_26a;
  bool local_269;
  Color local_25c;
  Color32 local_24c;
  long lStack_248;
  Color32 c_1;
  size_type pos_1;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  undefined1 local_220 [8];
  string response_1;
  Color local_1fc;
  Color32 local_1e0;
  Color local_1dc;
  Color32 local_1cc;
  long lStack_1c8;
  Color32 c;
  size_type pos;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  undefined1 local_1a0 [8];
  string response;
  Color local_180;
  char *local_170;
  size_t local_168;
  char *local_160;
  size_t local_158;
  char *local_150;
  size_t local_148;
  char *local_140;
  size_t local_138;
  char *local_130;
  size_t local_128;
  char *local_120;
  size_t local_118;
  bool local_109;
  char *pcStack_108;
  bool has_ansi;
  size_t local_100;
  byte local_f1;
  char *pcStack_f0;
  bool has_256color;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  size_t local_c8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  size_t local_a8;
  bool local_99;
  char *pcStack_98;
  bool has_truecolor;
  size_t local_90;
  byte local_81;
  undefined1 auStack_80 [7];
  bool xterm_like;
  char *local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  char *local_50;
  char *tmp;
  string_view vte_version;
  string_view colorterm;
  string_view name;
  TerminalInfo *this_local;
  
  bVar1 = is_terminal(this);
  if (bVar1) {
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&colorterm._M_str);
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&vte_version._M_str);
    std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
    basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&tmp);
    local_50 = getenv("TERM");
    if (local_50 != (char *)0x0) {
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view(&local_60,local_50);
      colorterm._M_str = (char *)local_60._M_len;
      name._M_len = (size_t)local_60._M_str;
    }
    local_50 = getenv("COLORTERM");
    if (local_50 != (char *)0x0) {
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view(&local_70,local_50);
      vte_version._M_str = (char *)local_70._M_len;
      colorterm._M_len = (size_t)local_70._M_str;
    }
    local_50 = getenv("VTE_VERSION");
    if (local_50 != (char *)0x0) {
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)auStack_80,local_50);
      tmp = _auStack_80;
      vte_version._M_len = (size_t)local_78;
    }
    pcStack_98 = colorterm._M_str;
    local_90 = name._M_len;
    haystack._M_str = "xterm";
    haystack._M_len = name._M_len;
    local_81 = detail::contains<char_const(&)[6]>
                         ((detail *)colorterm._M_str,haystack,(char (*) [6])in_RCX);
    bVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
            empty((basic_string_view<char,_std::char_traits<char>_> *)&tmp);
    if (bVar1) {
      local_b0 = vte_version._M_str;
      local_a8 = colorterm._M_len;
      haystack_00._M_str = "truecolor";
      haystack_00._M_len = colorterm._M_len;
      bVar1 = detail::contains<char_const(&)[10]>((detail *)vte_version._M_str,haystack_00,in_RCX);
      needle = (char (*) [8])CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
      local_26c = true;
      if (!bVar1) {
        local_c0 = colorterm._M_str;
        local_b8 = name._M_len;
        haystack_01._M_str = "cygwin";
        haystack_01._M_len = name._M_len;
        bVar1 = detail::contains<char_const(&)[7]>
                          ((detail *)colorterm._M_str,haystack_01,(char (*) [7])needle);
        needle = (char (*) [8])CONCAT71((int7)((ulong)needle >> 8),bVar1);
        local_26c = true;
        if (!bVar1) {
          local_d0 = vte_version._M_str;
          local_c8 = colorterm._M_len;
          haystack_02._M_str = "cygwin";
          haystack_02._M_len = colorterm._M_len;
          bVar1 = detail::contains<char_const(&)[7]>
                            ((detail *)vte_version._M_str,haystack_02,(char (*) [7])needle);
          needle = (char (*) [8])CONCAT71((int7)((ulong)needle >> 8),bVar1);
          local_26c = true;
          if (!bVar1) {
            local_e0 = colorterm._M_str;
            local_d8 = name._M_len;
            haystack_03._M_str = "konsole";
            haystack_03._M_len = name._M_len;
            bVar1 = detail::contains<char_const(&)[8]>
                              ((detail *)colorterm._M_str,haystack_03,needle);
            needle = (char (*) [8])CONCAT71((int7)((ulong)needle >> 8),bVar1);
            local_26c = true;
            if (!bVar1) {
              pcStack_f0 = vte_version._M_str;
              local_e8 = colorterm._M_len;
              haystack_04._M_str = "konsole";
              haystack_04._M_len = colorterm._M_len;
              local_26c = detail::contains<char_const(&)[8]>
                                    ((detail *)vte_version._M_str,haystack_04,needle);
            }
          }
        }
      }
      local_26b = local_26c;
    }
    else {
      pcVar3 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::operator[]((basic_string_view<char,_std::char_traits<char>_> *)&tmp,0);
      needle = (char (*) [8])(ulong)(uint)(int)*pcVar3;
      local_269 = true;
      if (*pcVar3 < 0x34) {
        pcVar3 = std::experimental::fundamentals_v1::
                 basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&tmp,0);
        needle = (char (*) [8])(ulong)(uint)(int)*pcVar3;
        local_26a = false;
        if ((int)*pcVar3 == 0x33) {
          pcVar3 = std::experimental::fundamentals_v1::
                   basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&tmp,1);
          local_26a = '5' < *pcVar3;
        }
        local_269 = local_26a;
      }
      local_26b = local_269;
    }
    local_99 = local_26b;
    local_26d = 1;
    if (local_26b == false) {
      pcStack_108 = colorterm._M_str;
      local_100 = name._M_len;
      haystack_05._M_str = "256";
      haystack_05._M_len = name._M_len;
      bVar1 = detail::contains<char_const(&)[4]>
                        ((detail *)colorterm._M_str,haystack_05,(char (*) [4])needle);
      needle = (char (*) [8])CONCAT71((int7)((ulong)needle >> 8),bVar1);
      local_26d = 1;
      if (!bVar1) {
        bVar1 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::empty((basic_string_view<char,_std::char_traits<char>_> *)&vte_version._M_str);
        local_26d = bVar1 ^ 0xff;
      }
    }
    local_f1 = local_26d & 1;
    local_26e = true;
    if ((local_f1 == 0) && (local_26e = true, (local_81 & 1) == 0)) {
      local_120 = colorterm._M_str;
      local_118 = name._M_len;
      haystack_06._M_str = "screen";
      haystack_06._M_len = name._M_len;
      bVar1 = detail::contains<char_const(&)[7]>
                        ((detail *)colorterm._M_str,haystack_06,(char (*) [7])needle);
      pacVar6 = (char (*) [6])CONCAT71((int7)((ulong)needle >> 8),bVar1);
      local_26e = true;
      if (!bVar1) {
        local_130 = colorterm._M_str;
        local_128 = name._M_len;
        haystack_07._M_str = "vt100";
        haystack_07._M_len = name._M_len;
        bVar1 = detail::contains<char_const(&)[6]>((detail *)colorterm._M_str,haystack_07,pacVar6);
        pacVar6 = (char (*) [6])CONCAT71((int7)((ulong)pacVar6 >> 8),bVar1);
        local_26e = true;
        if (!bVar1) {
          local_140 = colorterm._M_str;
          local_138 = name._M_len;
          haystack_08._M_str = "color";
          haystack_08._M_len = name._M_len;
          bVar1 = detail::contains<char_const(&)[6]>((detail *)colorterm._M_str,haystack_08,pacVar6)
          ;
          needle_00 = (char (*) [5])CONCAT71((int7)((ulong)pacVar6 >> 8),bVar1);
          local_26e = true;
          if (!bVar1) {
            local_150 = colorterm._M_str;
            local_148 = name._M_len;
            haystack_09._M_str = "ansi";
            haystack_09._M_len = name._M_len;
            bVar1 = detail::contains<char_const(&)[5]>
                              ((detail *)colorterm._M_str,haystack_09,needle_00);
            needle_01 = (char (*) [7])CONCAT71((int7)((ulong)needle_00 >> 8),bVar1);
            local_26e = true;
            if (!bVar1) {
              local_160 = colorterm._M_str;
              local_158 = name._M_len;
              haystack_10._M_str = "cygwin";
              haystack_10._M_len = name._M_len;
              bVar1 = detail::contains<char_const(&)[7]>
                                ((detail *)colorterm._M_str,haystack_10,needle_01);
              local_26e = true;
              if (!bVar1) {
                local_170 = colorterm._M_str;
                local_168 = name._M_len;
                haystack_11._M_str = "linux";
                haystack_11._M_len = name._M_len;
                local_26e = detail::contains<char_const(&)[6]>
                                      ((detail *)colorterm._M_str,haystack_11,
                                       (char (*) [6])CONCAT71((int7)((ulong)needle_01 >> 8),bVar1));
              }
            }
          }
        }
      }
    }
    local_109 = local_26e;
    if (this->mode == None) {
      if ((local_99 & 1U) == 0) {
        if ((local_f1 & 1) == 0) {
          local_278 = None;
          if (local_26e != false) {
            local_278 = Ansi;
          }
        }
        else {
          local_278 = Ansi256;
        }
        local_274 = local_278;
      }
      else {
        local_274 = Iso24bit;
      }
      this->mode = local_274;
    }
    local_279 = false;
    if ((local_81 & 1) != 0) {
      Color::Color(&local_180,0.9,0.9,0.9,1.0);
      local_279 = Color::operator==(&this->foreground_color,&local_180);
    }
    if (local_279 != false) {
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view(&local_1b0,"\x1b]10;?\x1b\\");
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&pos,"\a\\");
      cmd._M_str = (char *)local_1b0._M_len;
      cmd._M_len = (size_t)this;
      terminator._M_str = (char *)pos;
      terminator._M_len = (size_t)local_1b0._M_str;
      query<void>((TerminalInfo *)local_1a0,cmd,terminator);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (lStack_1c8 = std::__cxx11::string::find(local_1a0,0x11e3cd), lStack_1c8 != -1)) {
        lStack_1c8 = lStack_1c8 + 4;
        local_1cc.r = 0xff;
        local_1cc.g = 0xff;
        local_1cc.b = 0xff;
        local_1cc.a = 0xff;
        lVar5 = std::__cxx11::string::c_str();
        iVar2 = __isoc99_sscanf(lVar5 + lStack_1c8,"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&local_1cc,
                                &local_1cc.g,&local_1cc.b);
        if (iVar2 == 3) {
          local_1e0 = local_1cc;
          Color::Color(&local_1dc,local_1cc,0xff,0xff);
          (this->foreground_color).r = local_1dc.r;
          (this->foreground_color).g = local_1dc.g;
          (this->foreground_color).b = local_1dc.b;
          (this->foreground_color).a = local_1dc.a;
        }
      }
      std::__cxx11::string::~string((string *)local_1a0);
    }
    local_289 = false;
    if ((local_81 & 1) != 0) {
      Color::Color(&local_1fc,0.0,0.0,0.0,1.0);
      local_289 = Color::operator==(&this->background_color,&local_1fc);
    }
    if (local_289 != false) {
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view(&local_230,"\x1b]11;?\x1b\\");
      std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
      basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&pos_1,"\a\\");
      cmd_00._M_str = (char *)local_230._M_len;
      cmd_00._M_len = (size_t)this;
      terminator_00._M_str = (char *)pos_1;
      terminator_00._M_len = (size_t)local_230._M_str;
      query<void>((TerminalInfo *)local_220,cmd_00,terminator_00);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (lStack_248 = std::__cxx11::string::find(local_220,0x11e3cd), lStack_248 != -1)) {
        lStack_248 = lStack_248 + 4;
        local_24c.r = '\0';
        local_24c.g = '\0';
        local_24c.b = '\0';
        local_24c.a = 0xff;
        lVar5 = std::__cxx11::string::c_str();
        iVar2 = __isoc99_sscanf(lVar5 + lStack_248,"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&local_24c,
                                &local_24c.g,&local_24c.b);
        if (iVar2 == 3) {
          Color::Color(&local_25c,local_24c,0xff,0xff);
          (this->background_color).r = local_25c.r;
          (this->background_color).g = local_25c.g;
          (this->background_color).b = local_25c.b;
          (this->background_color).a = local_25c.a;
        }
      }
      std::__cxx11::string::~string((string *)local_220);
    }
  }
  return this;
}

Assistant:

TerminalInfo& TerminalInfo::detect() {
    if (!is_terminal())
        return *this;

    string_view name, colorterm, vte_version;

    auto tmp = std::getenv(u8"TERM");
    if (tmp) name = tmp;

    tmp = std::getenv(u8"COLORTERM");
    if (tmp) colorterm = tmp;

    tmp = std::getenv(u8"VTE_VERSION");
    if (tmp) vte_version = tmp;

    bool xterm_like = detail::contains(name, u8"xterm");

    bool has_truecolor =
        !vte_version.empty()
            ? (vte_version[0] > '3' || (vte_version[0] == '3' && vte_version[1] >= '6')) // VTE >= 0.36 supports true color
            : detail::contains(colorterm, u8"truecolor") ||
              detail::contains(name, u8"cygwin") ||
              detail::contains(colorterm, u8"cygwin") ||
              detail::contains(name, u8"konsole") ||
              detail::contains(colorterm, u8"konsole");

    bool has_256color = has_truecolor ||
                        detail::contains(name, u8"256") ||
                        !colorterm.empty();

    bool has_ansi = has_256color ||
                    xterm_like ||
                    detail::contains(name, u8"screen") ||
                    detail::contains(name, u8"vt100") ||
                    detail::contains(name, u8"color") ||
                    detail::contains(name, u8"ansi") ||
                    detail::contains(name, u8"cygwin") ||
                    detail::contains(name, u8"linux");

    if (mode == TerminalMode::None)
        mode = has_truecolor ? TerminalMode::Iso24bit
                             : has_256color ? TerminalMode::Ansi256
                                            : has_ansi ? TerminalMode::Ansi
                                                       : TerminalMode::None;

    if (xterm_like && foreground_color == Color(0.9f, 0.9f, 0.9f, 1)) {
        auto response = query(u8"\x1b]10;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 255, 255, 255, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    foreground_color = c;
            }
        }
    }

    if (xterm_like && background_color == Color(0, 0, 0, 1)) {
        auto response = query(u8"\x1b]11;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 0, 0, 0, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    background_color = c;
            }
        }
    }

    return *this;
}